

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnCatchExpr(Validator *this,TryExpr *param_1,Catch *catch_)

{
  bool is_catch_all;
  Var local_78;
  Enum local_2c;
  Catch *local_28;
  Catch *catch__local;
  TryExpr *param_1_local;
  Validator *this_local;
  
  local_28 = catch_;
  catch__local = (Catch *)param_1;
  param_1_local = (TryExpr *)this;
  Var::Var(&local_78,&catch_->var);
  is_catch_all = Catch::IsCatchAll(local_28);
  local_2c = (Enum)SharedValidator::OnCatch(&this->validator_,&catch_->loc,&local_78,is_catch_all);
  Result::operator|=(&this->result_,(Result)local_2c);
  Var::~Var(&local_78);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnCatchExpr(TryExpr*, Catch* catch_) {
  result_ |= validator_.OnCatch(catch_->loc, catch_->var, catch_->IsCatchAll());
  return Result::Ok;
}